

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-uni.c
# Opt level: O1

void client_communicate(int descriptor,Arguments *args)

{
  int iVar1;
  ssize_t sVar2;
  uint64_t timestamp;
  bench_t local_20;
  
  if (0 < args->count) {
    do {
      local_20 = now();
      sVar2 = write(descriptor,&local_20,8);
      if (sVar2 == -1) {
        throw("Error writing to eventfd");
      }
      iVar1 = args->count;
      args->count = iVar1 + -1;
    } while (1 < iVar1);
  }
  return;
}

Assistant:

void client_communicate(int descriptor, struct Arguments* args) {
	uint64_t timestamp;

	for (; args->count > 0; --args->count) {
		timestamp = now();

		// A write *adds* the value stored in the
		// eventfd to the value in the 8-byte buffer passed.
		// Here we send the current timestamp to the server
		if (write(descriptor, &timestamp, 8) == -1) {
			throw("Error writing to eventfd");
		}
	}
}